

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int xmlXPathIsInf(double val)

{
  int iVar1;
  
  iVar1 = ((0.0 < val) - 1) + (uint)(0.0 < val);
  if (ABS(val) != INFINITY) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
xmlXPathIsInf(double val) {
#ifdef isinf
    return isinf(val) ? (val > 0 ? 1 : -1) : 0;
#else
    if (val >= xmlXPathPINF)
        return 1;
    if (val <= -xmlXPathPINF)
        return -1;
    return 0;
#endif
}